

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O2

int reset_kernel_filter(pcap_t *handle)

{
  uint in_EAX;
  int iVar1;
  ulong uStack_8;
  int dummy;
  
  uStack_8 = (ulong)in_EAX;
  iVar1 = setsockopt(handle->fd,1,0x1b,&dummy,4);
  return iVar1;
}

Assistant:

static int
reset_kernel_filter(pcap_t *handle)
{
	/*
	 * setsockopt() barfs unless it get a dummy parameter.
	 * valgrind whines unless the value is initialized,
	 * as it has no idea that setsockopt() ignores its
	 * parameter.
	 */
	int dummy = 0;

	return setsockopt(handle->fd, SOL_SOCKET, SO_DETACH_FILTER,
				   &dummy, sizeof(dummy));
}